

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::ChompSetGroupInst<(UnifiedRegex::ChompMode)0>::Exec
          (ChompSetGroupInst<(UnifiedRegex::ChompMode)0> *this,Matcher *matcher,Char *input,
          CharCount inputLength,CharCount *matchStart,CharCount *inputOffset,
          CharCount *nextSyncInputOffset,uint8 **instPointer,ContStack *contStack,
          AssertionStack *assertionStack,uint *qcTicks,bool firstIteration)

{
  Char CVar1;
  uint uVar2;
  int iVar3;
  PageAllocation *pPVar4;
  GroupInfo *pGVar5;
  code *pcVar6;
  bool bVar7;
  undefined4 *puVar8;
  Type pRVar9;
  size_t sVar10;
  uint uVar11;
  long lVar12;
  
  uVar2 = (this->super_GroupMixin).groupId;
  if (((long)(int)uVar2 < 0) || (((matcher->program).ptr)->numGroups <= uVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                       "groupId >= 0 && groupId < program->numGroups");
    if (!bVar7) goto LAB_00ef0053;
    *puVar8 = 0;
  }
  if ((matcher->groupInfos).ptr[(int)uVar2].length != 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0xf80,"(matcher.GroupIdToGroupInfo(groupId)->IsUndefined())",
                       "matcher.GroupIdToGroupInfo(groupId)->IsUndefined()");
    if (!bVar7) goto LAB_00ef0053;
    *puVar8 = 0;
  }
  uVar2 = *inputOffset;
  pRVar9 = matcher->stats;
  if (pRVar9 != (Type)0x0) {
    pRVar9->numCompares = pRVar9->numCompares + 1;
  }
  uVar11 = uVar2;
  while( true ) {
    if (pRVar9 != (Type)0x0) {
      pRVar9->numCompares = pRVar9->numCompares + 1;
    }
    if (inputLength <= uVar11) break;
    CVar1 = input[uVar11];
    if ((ushort)CVar1 < 0x100) {
      if (((this->super_SetMixin<false>).set.direct.vec[(ushort)CVar1 >> 5] >>
           ((ushort)CVar1 & 0x1f) & 1) == 0) break;
    }
    else {
      if (((this->super_SetMixin<false>).set.root == (CharSetNode *)0x0) ||
         (bVar7 = RuntimeCharSet<char16_t>::Get_helper
                            (&(this->super_SetMixin<false>).set,(uint)(ushort)CVar1), !bVar7))
      break;
      uVar11 = *inputOffset;
      pRVar9 = matcher->stats;
    }
    uVar11 = uVar11 + 1;
    *inputOffset = uVar11;
  }
  if ((this->super_NoNeedToSaveMixin).noNeedToSave == false) {
    sVar10 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.bufferSize;
    if (sVar10 - (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                 super_ContinuousPageStack<1UL>.nextTop < 0x18) {
      ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x18);
      sVar10 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
               super_ContinuousPageStack<1UL>.bufferSize;
    }
    if (sVar10 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,199,"(bufferSize)","bufferSize");
      if (!bVar7) goto LAB_00ef0053;
      *puVar8 = 0;
    }
    pPVar4 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.pageAllocation;
    sVar10 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.nextTop;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
    super_ContinuousPageStack<1UL>.nextTop = sVar10 + 0x18;
    *(size_t *)((long)&pPVar4[1].pageCount + sVar10) =
         (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
         topElementSize;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).topElementSize
         = 0x18;
    iVar3 = (this->super_GroupMixin).groupId;
    *(undefined1 *)((long)&pPVar4[2].pageCount + sVar10) = 3;
    *(undefined ***)((long)&pPVar4[1].segment + sVar10) = &PTR_Print_01543308;
    *(int *)((long)&pPVar4[2].pageCount + sVar10 + 4) = iVar3;
    Matcher::PushStats(matcher,contStack,input);
  }
  uVar11 = (this->super_GroupMixin).groupId;
  lVar12 = (long)(int)uVar11;
  if ((lVar12 < 0) || (((matcher->program).ptr)->numGroups <= uVar11)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                       "groupId >= 0 && groupId < program->numGroups");
    if (!bVar7) {
LAB_00ef0053:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar8 = 0;
  }
  pGVar5 = (matcher->groupInfos).ptr;
  pGVar5[lVar12].offset = uVar2;
  pGVar5[lVar12].length = *inputOffset - uVar2;
  *instPointer = *instPointer + 0x2e;
  return false;
}

Assistant:

inline bool ChompSetGroupInst<Mode>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        Assert(matcher.GroupIdToGroupInfo(groupId)->IsUndefined());

        const CharCount inputStartOffset = inputOffset;
        const RuntimeCharSet<Char>& matchSet = this->set;
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if (Mode == ChompMode::Star || (inputOffset < inputLength && matchSet.Get(input[inputOffset])))
        {
            while (true)
            {
                if (Mode != ChompMode::Star)
                {
                    ++inputOffset;
                }
#if ENABLE_REGEX_CONFIG_OPTIONS
                matcher.CompStats();
#endif
                if (inputOffset < inputLength && matchSet.Get(input[inputOffset]))
                {
                    if (Mode == ChompMode::Star)
                    {
                        ++inputOffset;
                    }
                    continue;
                }
                break;
            }

            if (!noNeedToSave)
            {
                // UNDO ACTION: Restore group on backtrack
                PUSH(contStack, ResetGroupCont, groupId);
#if ENABLE_REGEX_CONFIG_OPTIONS
                matcher.PushStats(contStack, input);
#endif
            }

            GroupInfo *const groupInfo = matcher.GroupIdToGroupInfo(groupId);
            groupInfo->offset = inputStartOffset;
            groupInfo->length = inputOffset - inputStartOffset;

            instPointer += sizeof(*this);
            return false;
        }

        return matcher.Fail(FAIL_PARAMETERS);
    }